

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

int __thiscall
Centaurus::Grammar<unsigned_char>::parse
          (Grammar<unsigned_char> *this,string *filename,int machine_id)

{
  int iVar1;
  char *filename_00;
  int machine_id_local;
  string *filename_local;
  Grammar<unsigned_char> *this_local;
  
  filename_00 = (char *)std::__cxx11::string::c_str();
  iVar1 = parse(this,filename_00,machine_id);
  return iVar1;
}

Assistant:

ATNMachine(int id, Stream& stream)
        : m_globalid(id)
    {
        parse(stream);
    }